

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
          (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          longlong bits)

{
  long in_RSI;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  
  if (in_RSI < 0) {
    __assert_fail("!std::numeric_limits< U >::is_signed || bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x17a9,
                  "SafeInt<T, E> &SafeInt<long long>::operator>>=(U) [T = long long, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = long long]"
                 );
  }
  if (in_RSI < 0x40) {
    in_RDI->m_int = in_RDI->m_int >> ((byte)in_RSI & 0x3f);
    return in_RDI;
  }
  __assert_fail("bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17aa,
                "SafeInt<T, E> &SafeInt<long long>::operator>>=(U) [T = long long, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = long long]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator >>=( U bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || bits >= 0 );
        ShiftAssert( bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int >>= bits;
        return *this;
    }